

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O2

int run_test_getaddrinfo_basic(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  uVar2 = uv_default_loop();
  iVar1 = uv_getaddrinfo(uVar2,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",0,0);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    if (getaddrinfo_cbs == 1) {
      loop = (uv_loop_t *)uv_default_loop();
      close_loop(loop);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      pcVar3 = "0 == uv_loop_close(uv_default_loop())";
      uVar2 = 0x8d;
    }
    else {
      pcVar3 = "getaddrinfo_cbs == 1";
      uVar2 = 0x8b;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0x87;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(getaddrinfo_basic) {
  int r;
  getaddrinfo_handle = (uv_getaddrinfo_t*)malloc(sizeof(uv_getaddrinfo_t));

  r = uv_getaddrinfo(uv_default_loop(),
                     getaddrinfo_handle,
                     &getaddrinfo_basic_cb,
                     name,
                     NULL,
                     NULL);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(getaddrinfo_cbs == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}